

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfdata.cpp
# Opt level: O0

int __thiscall PFData::writeFile(PFData *this,string *filename)

{
  int iVar1;
  allocator_type *__a;
  string *in_RSI;
  long in_RDI;
  vector<long,_std::allocator<long>_> _offsets;
  vector<long,_std::allocator<long>_> *in_stack_000001b8;
  string *in_stack_000001c0;
  PFData *in_stack_000001c8;
  undefined1 *__n;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffffa0;
  undefined1 local_29 [41];
  
  __a = (allocator_type *)
        (long)(*(int *)(in_RDI + 0x74) * *(int *)(in_RDI + 0x70) * *(int *)(in_RDI + 0x6c) + 1);
  __n = local_29;
  std::allocator<long>::allocator((allocator<long> *)0x1103fd);
  std::vector<long,_std::allocator<long>_>::vector(in_stack_ffffffffffffffa0,(size_type)__n,__a);
  std::allocator<long>::~allocator((allocator<long> *)0x11041d);
  std::__cxx11::string::string((string *)&stack0xffffffffffffffa0,in_RSI);
  iVar1 = writeFile(in_stack_000001c8,in_stack_000001c0,in_stack_000001b8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  std::vector<long,_std::allocator<long>_>::~vector((vector<long,_std::allocator<long>_> *)__a);
  return iVar1;
}

Assistant:

int PFData::writeFile(const std::string filename) {
    std::vector<long> _offsets((m_p*m_q*m_r) + 1);
    return writeFile(filename, _offsets);
}